

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::BigUnsigned(BigUnsigned<84> *this,uint64_t v)

{
  uint local_24;
  uint64_t v_local;
  BigUnsigned<84> *this_local;
  
  if (v >> 0x20 == 0) {
    local_24 = (uint)(v != 0);
  }
  else {
    local_24 = 2;
  }
  this->size_ = local_24;
  memset(this->words_,0,0x150);
  *(uint64_t *)this->words_ = v;
  return;
}

Assistant:

explicit constexpr BigUnsigned(uint64_t v)
      : size_((v >> 32) ? 2 : v ? 1 : 0),
        words_{static_cast<uint32_t>(v & 0xffffffffu),
               static_cast<uint32_t>(v >> 32)} {}